

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall
httplib::Server::create_server_socket
          (Server *this,char *host,int port,int socket_flags,SocketOptions *socket_options)

{
  bool bVar1;
  int iVar2;
  socket_t sVar3;
  function<void_(int)> local_48;
  SocketOptions *local_28;
  SocketOptions *socket_options_local;
  int socket_flags_local;
  int port_local;
  char *host_local;
  Server *this_local;
  
  iVar2 = this->address_family_;
  bVar1 = this->tcp_nodelay_;
  local_28 = socket_options;
  socket_options_local._0_4_ = socket_flags;
  socket_options_local._4_4_ = port;
  _socket_flags_local = host;
  host_local = (char *)this;
  std::function<void_(int)>::function(&local_48,socket_options);
  sVar3 = detail::
          create_socket<httplib::Server::create_server_socket(char_const*,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                    (host,"",port,iVar2,socket_flags,bVar1 & 1,&local_48);
  std::function<void_(int)>::~function(&local_48);
  return sVar3;
}

Assistant:

inline socket_t
Server::create_server_socket(const char *host, int port, int socket_flags,
                             SocketOptions socket_options) const {
  return detail::create_socket(
      host, "", port, address_family_, socket_flags, tcp_nodelay_,
      std::move(socket_options),
      [](socket_t sock, struct addrinfo &ai) -> bool {
        if (::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
          return false;
        }
        if (::listen(sock, CPPHTTPLIB_LISTEN_BACKLOG)) { return false; }
        return true;
      });
}